

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O0

Status __thiscall
leveldb::TableCache::Get
          (TableCache *this,ReadOptions *options,uint64_t file_number,uint64_t file_size,Slice *k,
          void *arg,_func_void_void_ptr_Slice_ptr_Slice_ptr *handle_result)

{
  bool bVar1;
  long lVar2;
  Table local_68;
  ReadOptions *local_60;
  Table *t;
  undefined1 local_41;
  undefined8 local_40;
  Handle *handle;
  Slice *k_local;
  uint64_t file_size_local;
  uint64_t file_number_local;
  ReadOptions *options_local;
  TableCache *this_local;
  Status *s;
  
  local_40 = 0;
  local_41 = 0;
  handle = (Handle *)arg;
  k_local = k;
  file_size_local = file_size;
  file_number_local = file_number;
  options_local = options;
  this_local = this;
  FindTable(this,(uint64_t)options,file_size,(Handle **)k);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    lVar2 = (**(code **)(**(long **)(options + 3) + 0x28))(*(long **)(options + 3),local_40);
    local_60 = *(ReadOptions **)(lVar2 + 8);
    Table::InternalGet(&local_68,local_60,(Slice *)file_number_local,handle,handle_result);
    Status::operator=((Status *)this,(Status *)&local_68);
    Status::~Status((Status *)&local_68);
    (**(code **)(**(long **)(options + 3) + 0x20))(*(long **)(options + 3),local_40);
  }
  return (Status)(char *)this;
}

Assistant:

Status TableCache::Get(const ReadOptions& options, uint64_t file_number,
                       uint64_t file_size, const Slice& k, void* arg,
                       void (*handle_result)(void*, const Slice&,
                                             const Slice&)) {
  Cache::Handle* handle = nullptr;
  Status s = FindTable(file_number, file_size, &handle);
  if (s.ok()) {
    Table* t = reinterpret_cast<TableAndFile*>(cache_->Value(handle))->table;
    s = t->InternalGet(options, k, arg, handle_result);
    cache_->Release(handle);
  }
  return s;
}